

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaExpandAttributeGroupRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr item,
              xmlSchemaWildcardPtr *completeWild,xmlSchemaItemListPtr list,
              xmlSchemaItemListPtr prohibs)

{
  int *item_00;
  xmlSchemaAttributeGroupPtr_conflict attrGr;
  xmlSchemaPtr schema;
  long *plVar1;
  void *pvVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlNodePtr pxVar5;
  xmlSchemaWildcardPtr dest;
  xmlSchemaWildcardNsPtr pxVar6;
  void **ppvVar7;
  xmlChar *pxVar8;
  _xmlSchemaWildcardNs *p_Var9;
  xmlSchemaWildcardNsPtr *ppxVar10;
  long lVar11;
  ulong uVar12;
  xmlSchemaWildcardNsPtr pxVar13;
  xmlSchemaWildcardNsPtr pxVar14;
  bool bVar15;
  ulong uVar16;
  xmlSchemaWildcardPtr source;
  uint idx;
  long lVar17;
  xmlSchemaWildcardNsPtr *ppxVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  xmlChar *in_stack_ffffffffffffff90;
  xmlChar *local_40;
  xmlSchemaBasicItemPtr local_38;
  
  bVar21 = *completeWild != (xmlSchemaWildcardPtr)0x0;
  if (prohibs != (xmlSchemaItemListPtr)0x0) {
    prohibs->nbItems = 0;
  }
  iVar19 = 0;
  local_38 = item;
  do {
    if (list->nbItems <= iVar19) {
      if ((prohibs == (xmlSchemaItemListPtr)0x0) ||
         (idx = prohibs->nbItems, list->nbItems == 0 || idx == 0)) {
        return 0;
      }
      do {
        if ((int)idx < 1) {
          return 0;
        }
        idx = idx - 1;
        pvVar2 = prohibs->items[idx];
        uVar12 = (ulong)(uint)list->nbItems;
        if (list->nbItems < 1) {
          uVar12 = 0;
        }
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          lVar17 = *(long *)((long)list->items[uVar16] + 0x18);
          if ((*(xmlChar **)((long)pvVar2 + 0x10) == *(xmlChar **)(lVar17 + 0x10)) &&
             (*(xmlChar **)((long)pvVar2 + 0x18) == *(xmlChar **)(lVar17 + 0x70))) {
            local_40 = (xmlChar *)0x0;
            pxVar5 = *(xmlNodePtr *)((long)pvVar2 + 8);
            pxVar8 = xmlSchemaFormatQName
                               (&local_40,*(xmlChar **)((long)pvVar2 + 0x18),
                                *(xmlChar **)((long)pvVar2 + 0x10));
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,pxVar5,
                       (xmlSchemaTypePtr)
                       "Skipping pointless attribute use prohibition \'%s\', since a corresponding attribute use exists already in the type definition"
                       ,(char *)pxVar8,(xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff90);
            if (local_40 != (xmlChar *)0x0) {
              (*xmlFree)(local_40);
            }
            iVar19 = xmlSchemaItemListRemove(prohibs,idx);
            if (iVar19 == -1) {
              return -1;
            }
            break;
          }
        }
      } while( true );
    }
    lVar17 = (long)iVar19;
    item_00 = (int *)list->items[lVar17];
    if (*item_00 == 2000) {
      if (item_00[4] == 0x10) {
        attrGr = *(xmlSchemaAttributeGroupPtr_conflict *)(item_00 + 2);
        if (attrGr == (xmlSchemaAttributeGroupPtr_conflict)0x0) {
          return -1;
        }
        if (((attrGr->flags & 1) == 0) &&
           (iVar4 = xmlSchemaAttributeGroupExpandRefs(pctxt,attrGr), iVar4 == -1)) {
          return -1;
        }
        source = attrGr->attributeWildcard;
        if (source != (xmlSchemaWildcardPtr)0x0) {
          dest = *completeWild;
          if (dest == (xmlSchemaWildcardPtr)0x0) {
            *completeWild = source;
          }
          else {
            if (!bVar21) {
              schema = pctxt->schema;
              pxVar5 = xmlSchemaGetComponentNode(local_38);
              dest = xmlSchemaAddWildcard(pctxt,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,pxVar5);
              if (dest == (xmlSchemaWildcardPtr)0x0) {
                return -1;
              }
              iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,*completeWild);
              if (iVar4 == -1) {
                return -1;
              }
              dest->processContents = (*completeWild)->processContents;
              *completeWild = dest;
              source = attrGr->attributeWildcard;
            }
            iVar4 = dest->any;
            if (iVar4 == source->any) {
              pxVar13 = dest->nsSet;
              if ((pxVar13 == (xmlSchemaWildcardNsPtr)0x0) !=
                  (source->nsSet != (xmlSchemaWildcardNsPtr)0x0)) {
                pxVar14 = dest->negNsSet;
                if (((pxVar14 == (xmlSchemaWildcardNsPtr)0x0) !=
                     (source->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
                   ((pxVar14 == (xmlSchemaWildcardNsPtr)0x0 ||
                    (pxVar14->value == source->negNsSet->value)))) {
                  bVar21 = true;
                  if (pxVar13 != (xmlSchemaWildcardNsPtr)0x0) {
                    bVar15 = true;
                    for (; pxVar14 = (xmlSchemaWildcardNsPtr)&source->nsSet,
                        pxVar13 != (xmlSchemaWildcardNsPtr)0x0; pxVar13 = pxVar13->next) {
                      do {
                        pxVar14 = pxVar14->next;
                        if (pxVar14 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001b812b;
                      } while (pxVar13->value != pxVar14->value);
                      bVar15 = false;
                    }
                    bVar21 = true;
                    if (bVar15) goto LAB_001b812b;
                  }
                  goto LAB_001b82b4;
                }
              }
            }
            else {
LAB_001b812b:
              if ((iVar4 != 0) && (iVar4 != source->any)) {
                iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,source);
                bVar21 = true;
                if (iVar4 == -1) {
                  return -1;
                }
                goto LAB_001b82b4;
              }
            }
            pxVar13 = dest->negNsSet;
            if ((pxVar13 == (xmlSchemaWildcardNsPtr)0x0) ||
               (source->nsSet == (xmlSchemaWildcardNsPtr)0x0)) {
              pxVar14 = source->negNsSet;
              p_Var9 = dest->nsSet;
              if (pxVar14 == (xmlSchemaWildcardNsPtr)0x0) {
                bVar21 = true;
                if ((p_Var9 != (_xmlSchemaWildcardNs *)0x0) &&
                   (bVar21 = true, source->nsSet != (xmlSchemaWildcardNsPtr)0x0)) {
                  pxVar13 = (xmlSchemaWildcardNsPtr)0x0;
LAB_001b81cf:
                  pxVar14 = p_Var9;
                  if (pxVar13 == (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar13 = (xmlSchemaWildcardNsPtr)&dest->nsSet;
                  }
                  while (pxVar6 = (xmlSchemaWildcardNsPtr)&source->nsSet,
                        pxVar14 != (xmlSchemaWildcardNsPtr)0x0) {
                    while (pxVar6 = pxVar6->next, pxVar6 != (xmlSchemaWildcardNsPtr)0x0) {
                      if (pxVar14->value == pxVar6->value) {
                        p_Var9 = pxVar14->next;
                        pxVar13 = pxVar14;
                        goto LAB_001b81cf;
                      }
                    }
                    pxVar6 = pxVar14->next;
                    pxVar13->next = pxVar6;
                    (*xmlFree)(pxVar14);
                    pxVar14 = pxVar6;
                  }
                  goto LAB_001b82ad;
                }
              }
              else {
                if (p_Var9 != (_xmlSchemaWildcardNs *)0x0) goto LAB_001b819c;
                bVar21 = true;
                if (pxVar13 != (xmlSchemaWildcardNsPtr)0x0) {
                  pxVar8 = pxVar13->value;
                  pxVar3 = pxVar14->value;
                  if (((pxVar8 == (xmlChar *)0x0) || (pxVar8 == pxVar3)) ||
                     (pxVar3 == (xmlChar *)0x0)) {
                    bVar21 = true;
                    if ((pxVar8 != (xmlChar *)0x0) || (bVar21 = true, pxVar3 == (xmlChar *)0x0))
                    goto LAB_001b82b4;
                    pxVar13->value = pxVar3;
                  }
                  else {
                    xmlSchemaPErr(pctxt,dest->node,0x701,
                                  "The intersection of the wildcard is not expressible.\n",
                                  (xmlChar *)0x0,(xmlChar *)0x0);
                  }
LAB_001b82ad:
                  bVar21 = true;
                }
              }
            }
            else {
              if (dest->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
                pxVar8 = pxVar13->value;
                iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,source);
                if (iVar4 == -1) {
                  return -1;
                }
              }
              else {
                pxVar14 = source->negNsSet;
LAB_001b819c:
                pxVar8 = pxVar14->value;
              }
              ppxVar18 = &dest->nsSet;
              pxVar14 = (xmlSchemaWildcardNsPtr)0x0;
              pxVar13 = (xmlSchemaWildcardNsPtr)ppxVar18;
              do {
                pxVar6 = pxVar14;
                pxVar13 = pxVar13->next;
                if (pxVar13 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001b8272;
                pxVar14 = pxVar13;
              } while (pxVar13->value != (xmlChar *)0x0);
              if (pxVar6 == (xmlSchemaWildcardNsPtr)0x0) {
                pxVar6 = (xmlSchemaWildcardNsPtr)ppxVar18;
              }
              pxVar6->next = pxVar13->next;
              (*xmlFree)(pxVar13);
LAB_001b8272:
              bVar21 = true;
              if (pxVar8 != (xmlChar *)0x0) {
                pxVar14 = (xmlSchemaWildcardNsPtr)(xmlSchemaWildcardNsPtr *)0x0;
                pxVar13 = (xmlSchemaWildcardNsPtr)ppxVar18;
                do {
                  ppxVar10 = &pxVar14->next;
                  pxVar13 = pxVar13->next;
                  if (pxVar13 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001b82ad;
                  pxVar14 = pxVar13;
                } while (pxVar13->value != pxVar8);
                if (ppxVar10 != (xmlSchemaWildcardNsPtr *)0x0) {
                  ppxVar18 = ppxVar10;
                }
                *ppxVar18 = pxVar13->next;
                (*xmlFree)(pxVar13);
                goto LAB_001b82ad;
              }
            }
          }
        }
LAB_001b82b4:
        plVar1 = (long *)attrGr->attrUses;
        if ((plVar1 == (long *)0x0) || (iVar4 = (int)plVar1[1], iVar4 == 0)) {
          iVar4 = xmlSchemaItemListRemove(list,iVar19);
          if (iVar4 == -1) {
            return -1;
          }
          iVar19 = iVar19 + -1;
        }
        else {
          list->items[lVar17] = *(void **)*plVar1;
          if (iVar4 != 1) {
            for (lVar20 = 1; lVar20 < iVar4; lVar20 = lVar20 + 1) {
              pvVar2 = *(void **)(*plVar1 + lVar20 * 8);
              ppvVar7 = list->items;
              if (ppvVar7 == (void **)0x0) {
                ppvVar7 = (void **)(*xmlMalloc)(0xa0);
                list->items = ppvVar7;
                if (ppvVar7 == (void **)0x0) {
                  xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating new item list",
                                      (xmlNodePtr)0x0);
                  return -1;
                }
                list->sizeItems = 0x14;
              }
              else {
                iVar19 = list->sizeItems;
                if (iVar19 <= list->nbItems) {
                  list->sizeItems = iVar19 * 2;
                  ppvVar7 = (void **)(*xmlRealloc)(ppvVar7,(long)iVar19 << 4);
                  list->items = ppvVar7;
                  if (ppvVar7 == (void **)0x0) {
                    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"growing item list",
                                        (xmlNodePtr)0x0);
                    list->sizeItems = 0;
                    return -1;
                  }
                }
              }
              lVar17 = lVar17 + 1;
              iVar19 = list->nbItems;
              lVar11 = (long)iVar19;
              if (lVar17 < lVar11) {
                for (; lVar17 < lVar11; lVar11 = lVar11 + -1) {
                  ppvVar7[lVar11] = ppvVar7[lVar11 + -1];
                  ppvVar7 = list->items;
                }
                ppvVar7[lVar17] = pvVar2;
                list->nbItems = iVar19 + 1;
              }
              else {
                list->nbItems = iVar19 + 1;
                ppvVar7[lVar11] = pvVar2;
              }
              iVar4 = (int)plVar1[1];
            }
            iVar19 = (int)lVar17;
          }
        }
      }
    }
    else if (*item_00 == 0x7d1) {
      if (prohibs == (xmlSchemaItemListPtr)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaExpandAttributeGroupRefs",
                   "unexpected attr prohibition found");
        return -1;
      }
      iVar4 = xmlSchemaItemListRemove(list,iVar19);
      if (iVar4 == -1) {
        return -1;
      }
      iVar19 = iVar19 + -1;
      xmlSchemaItemListAddSize(prohibs,2,item_00);
    }
    iVar19 = iVar19 + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaExpandAttributeGroupRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaBasicItemPtr item,
				  xmlSchemaWildcardPtr *completeWild,
				  xmlSchemaItemListPtr list,
				  xmlSchemaItemListPtr prohibs)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr sublist;
    int i, j;
    int created = (*completeWild == NULL) ? 0 : 1;

    if (prohibs)
	prohibs->nbItems = 0;

    for (i = 0; i < list->nbItems; i++) {
	use = list->items[i];

	if (use->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
	    if (prohibs == NULL) {
		PERROR_INT("xmlSchemaExpandAttributeGroupRefs",
		    "unexpected attr prohibition found");
		return(-1);
	    }
	    /*
	    * Remove from attribute uses.
	    */
	    if (xmlSchemaItemListRemove(list, i) == -1)
		return(-1);
	    i--;
	    /*
	    * Note that duplicate prohibitions were already
	    * handled at parsing time.
	    */
	    /*
	    * Add to list of prohibitions.
	    */
	    xmlSchemaItemListAddSize(prohibs, 2, use);
	    continue;
	}
	if ((use->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    ((WXS_QNAME_CAST use)->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP))
	{
	    if ((WXS_QNAME_CAST use)->item == NULL)
		return(-1);
	    gr = WXS_ATTR_GROUP_CAST (WXS_QNAME_CAST use)->item;
	    /*
	    * Expand the referenced attr. group.
	    * TODO: remove this, this is done in a previous step, so
	    * already done here.
	    */
	    if ((gr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED) == 0) {
		if (xmlSchemaAttributeGroupExpandRefs(pctxt, gr) == -1)
		    return(-1);
	    }
	    /*
	    * Build the 'complete' wildcard; i.e. intersect multiple
	    * wildcards.
	    */
	    if (gr->attributeWildcard != NULL) {
		if (*completeWild == NULL) {
		    *completeWild = gr->attributeWildcard;
		} else {
		    if (! created) {
			xmlSchemaWildcardPtr tmpWild;

			 /*
			* Copy the first encountered wildcard as context,
			* except for the annotation.
			*
			* Although the complete wildcard might not correspond
			* to any node in the schema, we will anchor it on
			* the node of the owner component.
			*/
			tmpWild =  xmlSchemaAddWildcard(pctxt, pctxt->schema,
			    XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
			    WXS_ITEM_NODE(item));
			if (tmpWild == NULL)
			    return(-1);
			if (xmlSchemaCloneWildcardNsConstraints(pctxt,
			    tmpWild, *completeWild) == -1)
			    return (-1);
			tmpWild->processContents = (*completeWild)->processContents;
			*completeWild = tmpWild;
			created = 1;
		    }

		    if (xmlSchemaIntersectWildcards(pctxt, *completeWild,
			gr->attributeWildcard) == -1)
			return(-1);
		}
	    }
	    /*
	    * Just remove the reference if the referenced group does not
	    * contain any attribute uses.
	    */
	    sublist = ((xmlSchemaItemListPtr) gr->attrUses);
	    if ((sublist == NULL) || sublist->nbItems == 0) {
		if (xmlSchemaItemListRemove(list, i) == -1)
		    return(-1);
		i--;
		continue;
	    }
	    /*
	    * Add the attribute uses.
	    */
	    list->items[i] = sublist->items[0];
	    if (sublist->nbItems != 1) {
		for (j = 1; j < sublist->nbItems; j++) {
		    i++;
		    if (xmlSchemaItemListInsert(list,
			    sublist->items[j], i) == -1)
			return(-1);
		}
	    }
	}

    }
    /*
    * Handle pointless prohibitions of declared attributes.
    */
    if (prohibs && (prohibs->nbItems != 0) && (list->nbItems != 0)) {
	xmlSchemaAttributeUseProhibPtr prohib;

	for (i = prohibs->nbItems -1; i >= 0; i--) {
	    prohib = prohibs->items[i];
	    for (j = 0; j < list->nbItems; j++) {
		use = list->items[j];

		if ((prohib->name == WXS_ATTRUSE_DECL_NAME(use)) &&
		    (prohib->targetNamespace == WXS_ATTRUSE_DECL_TNS(use)))
		{
		    xmlChar *str = NULL;

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
			prohib->node, NULL,
			"Skipping pointless attribute use prohibition "
			"'%s', since a corresponding attribute use "
			"exists already in the type definition",
			xmlSchemaFormatQName(&str,
			    prohib->targetNamespace, prohib->name),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /*
		    * Remove the prohibition.
		    */
		    if (xmlSchemaItemListRemove(prohibs, i) == -1)
			return(-1);
		    break;
		}
	    }
	}
    }
    return(0);
}